

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void mbedtls_md5(uchar *input,size_t ilen,uchar *output)

{
  undefined1 local_78 [8];
  mbedtls_md5_context ctx;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer._56_8_ = output;
  mbedtls_md5_init((mbedtls_md5_context *)local_78);
  mbedtls_md5_starts((mbedtls_md5_context *)local_78);
  mbedtls_md5_update((mbedtls_md5_context *)local_78,input,ilen);
  mbedtls_md5_finish((mbedtls_md5_context *)local_78,(uchar *)ctx.buffer._56_8_);
  mbedtls_md5_free((mbedtls_md5_context *)local_78);
  return;
}

Assistant:

void mbedtls_md5( const unsigned char *input, size_t ilen, unsigned char output[16] )
{
    mbedtls_md5_context ctx;

    mbedtls_md5_init( &ctx );
    mbedtls_md5_starts( &ctx );
    mbedtls_md5_update( &ctx, input, ilen );
    mbedtls_md5_finish( &ctx, output );
    mbedtls_md5_free( &ctx );
}